

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O3

bool tcu::fuzzyCompare(TestLog *log,char *imageSetName,char *imageSetDesc,Surface *reference,
                      Surface *result,float threshold,CompareLogMode logMode)

{
  bool bVar1;
  void *pvVar2;
  TextureFormat local_88;
  ConstPixelBufferAccess local_80;
  ConstPixelBufferAccess local_58;
  
  local_80.m_format.order = RGBA;
  local_80.m_format.type = UNORM_INT8;
  pvVar2 = (void *)(reference->m_pixels).m_cap;
  if (pvVar2 != (void *)0x0) {
    pvVar2 = (reference->m_pixels).m_ptr;
  }
  ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_58,&local_80.m_format,reference->m_width,reference->m_height,1,pvVar2);
  local_88.order = RGBA;
  local_88.type = UNORM_INT8;
  pvVar2 = (void *)(result->m_pixels).m_cap;
  if (pvVar2 != (void *)0x0) {
    pvVar2 = (result->m_pixels).m_ptr;
  }
  ConstPixelBufferAccess::ConstPixelBufferAccess
            (&local_80,&local_88,result->m_width,result->m_height,1,pvVar2);
  bVar1 = fuzzyCompare(log,imageSetName,imageSetDesc,&local_58,&local_80,threshold,logMode);
  return bVar1;
}

Assistant:

bool fuzzyCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const Surface& reference, const Surface& result, float threshold, CompareLogMode logMode)
{
	return fuzzyCompare(log, imageSetName, imageSetDesc, reference.getAccess(), result.getAccess(), threshold, logMode);
}